

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DDLNodeTest.cpp
# Opt level: O1

void __thiscall
ODDLParser::DDLNodeTest_hasPropertiesTest_Test::~DDLNodeTest_hasPropertiesTest_Test
          (DDLNodeTest_hasPropertiesTest_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(DDLNodeTest, hasPropertiesTest) {
    DDLNode *node = DDLNode::create("test", "testName");
    ASSERT_FALSE(nullptr == node);
    EXPECT_FALSE(node->hasProperties());

    Text *id = new Text("test", 4);
    Property *first = new Property(id);
    node->setProperties(first);
    EXPECT_TRUE(node->hasProperties());
    delete node;
}